

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_ostream::write_uuid(raw_ostream *this,uint8_t *UUID)

{
  int Idx;
  uint uVar1;
  long lVar2;
  StringRef Str;
  format_object_base local_48;
  uint8_t local_38;
  
  lVar2 = 0;
  do {
    local_48.Fmt = "%02X";
    local_48._vptr_format_object_base = (_func_int **)&PTR_home_010780f0;
    local_38 = UUID[lVar2];
    operator<<(this,&local_48);
    uVar1 = (uint)lVar2;
    if ((((uVar1 & 0xb) == 3) || (uVar1 == 9)) || (uVar1 == 5)) {
      Str.Length = 1;
      Str.Data = "-";
      operator<<(this,Str);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return this;
}

Assistant:

raw_ostream &raw_ostream::write_uuid(const uuid_t UUID) {
  for (int Idx = 0; Idx < 16; ++Idx) {
    *this << format("%02" PRIX32, UUID[Idx]);
    if (Idx == 3 || Idx == 5 || Idx == 7 || Idx == 9)
      *this << "-";
  }
  return *this;
}